

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundary.c
# Opt level: O2

void initFlags(char *problem,char **FLAG,lattice *grid,MPI_Comm Region)

{
  int i_2;
  int iVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  byte bVar6;
  char **ppcVar7;
  int iVar8;
  int iVar9;
  char acStack_40 [16];
  
  builtin_strncpy(acStack_40,"cC\x10",4);
  acStack_40[4] = '\0';
  acStack_40[5] = '\0';
  acStack_40[6] = '\0';
  acStack_40[7] = '\0';
  iVar1 = strcmp(problem,"Step");
  if (iVar1 == 0) {
    iVar1 = grid->jmax;
    if (grid->imax < grid->jmax) {
      iVar1 = grid->imax;
    }
    acStack_40[0] = '\x02';
    acStack_40[1] = '\0';
    acStack_40[2] = '\0';
    acStack_40[3] = '\0';
    acStack_40[4] = '\0';
    acStack_40[5] = '\0';
    acStack_40[6] = '\0';
    acStack_40[7] = '\0';
    iVar1 = (iVar1 + 2) / 2;
    for (lVar3 = 0; (lVar3 < (long)grid->deli + 2 && (grid->il + (int)lVar3 < iVar1));
        lVar3 = lVar3 + 1) {
      for (lVar4 = 0; (lVar4 < (long)grid->delj + 2 && (grid->jb + (int)lVar4 < iVar1));
          lVar4 = lVar4 + 1) {
        FLAG[lVar3][lVar4] = '\0';
      }
    }
  }
  else {
    builtin_strncpy(acStack_40,"zC\x10",4);
    acStack_40[4] = '\0';
    acStack_40[5] = '\0';
    acStack_40[6] = '\0';
    acStack_40[7] = '\0';
    iVar1 = strcmp(problem,"Von Karman");
    if (iVar1 == 0) {
      ppcVar7 = FLAG + 1;
      acStack_40[0] = '\b';
      acStack_40[1] = '\0';
      acStack_40[2] = '\0';
      acStack_40[3] = '\0';
      acStack_40[4] = '\0';
      acStack_40[5] = '\0';
      acStack_40[6] = '\0';
      acStack_40[7] = '\0';
      for (lVar3 = 0; lVar3 < (long)grid->delj + 2; lVar3 = lVar3 + 1) {
        iVar8 = grid->il + (int)lVar3;
        iVar1 = grid->jmax;
        if (iVar1 / 3 <= iVar8) {
          if ((iVar1 * 2) / 3 <= iVar8) break;
          iVar8 = iVar1 / -8 + (int)lVar3;
          for (lVar4 = (long)(iVar1 / -8); lVar4 <= iVar1 / 8; lVar4 = lVar4 + 1) {
            iVar9 = grid->il + grid->jb + iVar8;
            if (iVar1 / 3 <= iVar9) {
              if (((iVar1 * 2) / 3 <= iVar9) || (grid->deli <= iVar9)) break;
              ppcVar7[lVar4][lVar3 + 1] = '\0';
              iVar1 = grid->jmax;
            }
            iVar8 = iVar8 + 1;
          }
        }
        ppcVar7 = ppcVar7 + 1;
      }
    }
  }
  iVar1 = grid->deli;
  if (grid->deli < grid->delj) {
    iVar1 = grid->delj;
  }
  uVar2 = (ulong)(iVar1 + 2) + 0xf & 0xfffffffffffffff0;
  pcVar5 = acStack_40 + (8 - uVar2) + -uVar2;
  pcVar5[-8] = -0x48;
  pcVar5[-7] = 'C';
  pcVar5[-6] = '\x10';
  pcVar5[-5] = '\0';
  pcVar5[-4] = '\0';
  pcVar5[-3] = '\0';
  pcVar5[-2] = '\0';
  pcVar5[-1] = '\0';
  exchangeIntMat(FLAG,acStack_40 + (8 - uVar2),pcVar5,grid,Region);
  lVar3 = 0;
  do {
    if ((long)grid->deli + 2 <= lVar3) {
      return;
    }
    for (lVar4 = 0; lVar4 < (long)grid->delj + 2; lVar4 = lVar4 + 1) {
      if ((grid->delj < lVar4) || (pcVar5 = FLAG[lVar3], pcVar5[lVar4 + 1] != '\x0f')) {
        if ((lVar4 != 0) && (pcVar5 = FLAG[lVar3], pcVar5[lVar4 + -1] == '\x0f')) {
          bVar6 = 4;
          goto LAB_00104404;
        }
      }
      else {
        bVar6 = 1;
LAB_00104404:
        pcVar5[lVar4] = pcVar5[lVar4] | bVar6;
      }
      if (((lVar3 <= grid->deli) && (bVar6 = 2, FLAG[lVar3 + 1][lVar4] == '\x0f')) ||
         ((lVar3 != 0 && (bVar6 = 8, FLAG[lVar3 + -1][lVar4] == '\x0f')))) {
        FLAG[lVar3][lVar4] = FLAG[lVar3][lVar4] | bVar6;
      }
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

void initFlags (const char *problem, char **FLAG, lattice *grid, MPI_Comm Region)
{
	/* Manually sets the flag field for arbitrary generalised geometries.
	 * If the flags are read from a file, set problem to "Image"! */
	if (strcmp(problem,"Step") == 0)
	{
		int max = grid->jmax;
		if (grid->imax < max)
			max = grid->imax;
		max = (max+2)/2;
		for (int i = 0; i < grid->deli+2; i++)
		{
			if (i + grid->il >= max)
				break;
			for (int j = 0; j < grid->delj+2; j++)
			{
				if (j + grid->jb >= max)
					break;
				FLAG[i][j] = C_B;
			}
		}
	}
	else if (strcmp(problem,"Von Karman") == 0)
	{
		for (int i = 0; i < grid->delj+2; i++)
		{
			if (i + grid->il < grid->jmax/3)
				continue;
			if (i + grid->il >= 2*grid->jmax/3)
				break;
			for (int j = -(grid->jmax/4)/2; j <= (grid->jmax/4)/2; j++)
			{
				int x = i+j+grid->il+grid->jb;
				if (x < grid->jmax/3)
					continue;
				if (x >= 2*grid->jmax/3 || x >= grid->deli)
					break;
				FLAG[i+j+1][i+1] = C_B;
			}
		}
	}
	int size = grid->deli+2;
	if (grid->delj+2 > size)
		size = grid->delj+2;
	char buf1[size], buf2[size];
	exchangeIntMat(FLAG,buf1,buf2,grid,Region);
	for (int i = 0; i < grid->deli+2; i++)
	{
		for (int j = 0; j < grid->delj+2; j++)
		{
			if ((j <= grid->delj) && (FLAG[i][j+1] == C_F))
				FLAG[i][j] |= B_N;
			else if ((j != 0) && (FLAG[i][j-1] == C_F))
				FLAG[i][j] |= B_S;
			if ((i <= grid->deli) && (FLAG[i+1][j] == C_F))
				FLAG[i][j] |= B_O;
			else if ((i != 0) && (FLAG[i-1][j] == C_F))
				FLAG[i][j] |= B_W;
		}
	}
	return;
}